

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

void __thiscall
wallet::CWallet::transactionRemovedFromMempool
          (CWallet *this,CTransactionRef *tx,MemPoolRemovalReason reason)

{
  element_type *peVar1;
  pointer pCVar2;
  bool bVar3;
  iterator iVar4;
  _Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false> _Var5;
  pointer __k;
  _Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false> __tmp;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
  pVar6;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock27;
  unique_lock<std::recursive_mutex> local_78;
  undefined1 local_68 [24];
  code *local_50;
  __index_type local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78._M_device = &(this->cs_wallet).super_recursive_mutex;
  local_78._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_78);
  iVar4 = std::
          _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->mapWallet)._M_h,
                 &(((tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->hash).m_wrapped);
  if (iVar4.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>._M_cur !=
      (__node_type *)0x0) {
    if (this->m_chain == (Chain *)0x0) {
      __assert_fail("m_chain",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                    ,0x1f5,"interfaces::Chain &wallet::CWallet::chain() const");
    }
    RefreshMempoolStatus
              ((CWalletTx *)
               ((long)iVar4.
                      super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                      _M_cur + 0x28),this->m_chain);
  }
  if (reason == CONFLICT) {
    local_68._0_8_ = local_68._0_8_ & 0xffffffffffffff00;
    local_40 = '\x02';
    bVar3 = AddToWalletIfInvolvingMe(this,tx,(SyncTxState *)local_68,true,false);
    if (bVar3) {
      MarkInputsDirty(this,tx);
    }
  }
  peVar1 = (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  __k = (peVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_start;
  pCVar2 = (peVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__k != pCVar2) {
    do {
      pVar6 = std::
              _Hashtable<COutPoint,_std::pair<const_COutPoint,_uint256>,_std::allocator<std::pair<const_COutPoint,_uint256>_>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
              ::equal_range(&(this->mapTxSpends)._M_h,&__k->prevout);
      for (_Var5._M_cur = (__node_type *)
                          pVar6.first.
                          super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>.
                          _M_cur;
          (_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>)_Var5._M_cur !=
          pVar6.second.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>._M_cur.
          super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>;
          _Var5._M_cur = (__node_type *)((_Var5._M_cur)->super__Hash_node_base)._M_nxt) {
        local_68._8_8_ = 0;
        local_50 = std::
                   _Function_handler<wallet::CWallet::TxUpdate_(wallet::CWalletTx_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp:1499:65)>
                   ::_M_invoke;
        local_68._16_8_ =
             std::
             _Function_handler<wallet::CWallet::TxUpdate_(wallet::CWalletTx_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp:1499:65)>
             ::_M_manager;
        local_68._0_8_ = &peVar1->hash;
        RecursiveUpdateTxState
                  (this,(WalletBatch *)0x0,
                   (uint256 *)
                   ((long)&((_Var5._M_cur)->
                           super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                           super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>.
                           _M_storage._M_storage + 0x24),(TryUpdatingStateFn *)local_68);
        if ((code *)local_68._16_8_ != (code *)0x0) {
          (*(code *)local_68._16_8_)
                    ((TryUpdatingStateFn *)local_68,(TryUpdatingStateFn *)local_68,3);
        }
      }
      __k = __k + 1;
    } while (__k != pCVar2);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::transactionRemovedFromMempool(const CTransactionRef& tx, MemPoolRemovalReason reason) {
    LOCK(cs_wallet);
    auto it = mapWallet.find(tx->GetHash());
    if (it != mapWallet.end()) {
        RefreshMempoolStatus(it->second, chain());
    }
    // Handle transactions that were removed from the mempool because they
    // conflict with transactions in a newly connected block.
    if (reason == MemPoolRemovalReason::CONFLICT) {
        // Trigger external -walletnotify notifications for these transactions.
        // Set Status::UNCONFIRMED instead of Status::CONFLICTED for a few reasons:
        //
        // 1. The transactionRemovedFromMempool callback does not currently
        //    provide the conflicting block's hash and height, and for backwards
        //    compatibility reasons it may not be not safe to store conflicted
        //    wallet transactions with a null block hash. See
        //    https://github.com/bitcoin/bitcoin/pull/18600#discussion_r420195993.
        // 2. For most of these transactions, the wallet's internal conflict
        //    detection in the blockConnected handler will subsequently call
        //    MarkConflicted and update them with CONFLICTED status anyway. This
        //    applies to any wallet transaction that has inputs spent in the
        //    block, or that has ancestors in the wallet with inputs spent by
        //    the block.
        // 3. Longstanding behavior since the sync implementation in
        //    https://github.com/bitcoin/bitcoin/pull/9371 and the prior sync
        //    implementation before that was to mark these transactions
        //    unconfirmed rather than conflicted.
        //
        // Nothing described above should be seen as an unchangeable requirement
        // when improving this code in the future. The wallet's heuristics for
        // distinguishing between conflicted and unconfirmed transactions are
        // imperfect, and could be improved in general, see
        // https://github.com/bitcoin-core/bitcoin-devwiki/wiki/Wallet-Transaction-Conflict-Tracking
        SyncTransaction(tx, TxStateInactive{});
    }

    const Txid& txid = tx->GetHash();

    for (const CTxIn& tx_in : tx->vin) {
        // Iterate over all wallet transactions spending txin.prev
        // and recursively mark them as no longer conflicting with
        // txid
        for (auto range = mapTxSpends.equal_range(tx_in.prevout); range.first != range.second; range.first++) {
            const uint256& spent_id = range.first->second;

            RecursiveUpdateTxState(/*batch=*/nullptr, spent_id, [&txid](CWalletTx& wtx) EXCLUSIVE_LOCKS_REQUIRED(cs_wallet) {
                return wtx.mempool_conflicts.erase(txid) ? TxUpdate::CHANGED : TxUpdate::UNCHANGED;
            });
        }
    }
}